

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O0

xr_writer * __thiscall
xray_re::xr_file_system::w_open(xr_file_system *this,char *path,bool ignore_ro)

{
  bool bVar1;
  value_type_conflict *pvVar2;
  int *piVar3;
  xr_writer *w;
  CPath ds;
  undefined1 local_58 [8];
  CPath p;
  FILE *outfile;
  bool ignore_ro_local;
  char *path_local;
  xr_file_system *this_local;
  
  CPath::CPath((CPath *)local_58,path);
  if ((ignore_ro) || (bVar1 = read_only(this), !bVar1)) {
    CPath::make_preferred_abi_cxx11_((CPath *)local_58);
    pvVar2 = std::filesystem::__cxx11::path::c_str((path *)local_58);
    p.super_path._32_8_ = fopen(pvVar2,"w");
    if ((FILE *)p.super_path._32_8_ == (FILE *)0x0) {
      piVar3 = __errno_location();
      if (*piVar3 == 2) {
        CPath::CPath((CPath *)&w,(CPath *)local_58);
        CPath::remove_filename_abi_cxx11_((CPath *)&w);
        bVar1 = CPath::create_directory_recursive((CPath *)&w);
        if (bVar1) {
          pvVar2 = std::filesystem::__cxx11::path::c_str((path *)local_58);
          this_local = (xr_file_system *)w_open(this,pvVar2,ignore_ro);
        }
        else {
          this_local = (xr_file_system *)0x0;
        }
        ds.super_path._M_cmpts = (_List)0x1;
        ds.super_path._33_3_ = 0;
        CPath::~CPath((CPath *)&w);
      }
      else {
        this_local = (xr_file_system *)0x0;
        ds.super_path._M_cmpts = (_List)0x1;
        ds.super_path._33_3_ = 0;
      }
    }
    else {
      this_local = (xr_file_system *)operator_new(0x2060);
      xr_file_writer_posix::xr_file_writer_posix
                ((xr_file_writer_posix *)this_local,(FILE *)p.super_path._32_8_);
      if ((xr_file_writer_posix *)this_local == (xr_file_writer_posix *)0x0) {
        fclose((FILE *)p.super_path._32_8_);
      }
      ds.super_path._M_cmpts = (_List)0x1;
      ds.super_path._33_3_ = 0;
    }
  }
  else {
    dbg("fs_ro: writing %s",path);
    this_local = (xr_file_system *)operator_new(0x2068);
    xr_fake_writer::xr_fake_writer((xr_fake_writer *)this_local);
    ds.super_path._M_cmpts = (_List)0x1;
    ds.super_path._33_3_ = 0;
  }
  CPath::~CPath((CPath *)local_58);
  return (xr_writer *)this_local;
}

Assistant:

xr_writer* xr_file_system::w_open(const char* path, bool ignore_ro) const
{
FILE* outfile;
CPath p(path);

	if (!ignore_ro && read_only()) {
		dbg("fs_ro: writing %s", path);
		return new xr_fake_writer();
	}

	p.make_preferred();
	outfile = fopen(p.c_str(), "w");
	if(outfile == nullptr)
	{
		if(errno == ENOENT)
		{
			auto ds{p};

			ds.remove_filename();
			if(!ds.create_directory_recursive())
				return nullptr;

			return w_open(p.c_str(), ignore_ro);
		}
		else
		{
			return nullptr;
		}
	}

	xr_writer* w = new xr_file_writer_posix(outfile);

	if(w == nullptr)
		fclose(outfile);

	return w;
}